

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifsysinfo(bifcxdef *ctx,int argc)

{
  int iVar1;
  int iVar2;
  runcxdef *ctx_00;
  int in_ESI;
  char *in_RDI;
  runcxdef *unaff_retaddr;
  long result;
  int id;
  runsdef val;
  int in_stack_ffffffffffffffbc;
  runcxdef *in_stack_ffffffffffffffc0;
  long lVar3;
  runcxdef *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar3 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar3 + -0x10;
  if (*(char *)(lVar3 + -0x10) != '\x01') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  lVar3 = *(long *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  iVar1 = (int)lVar3;
  ctx_00 = (runcxdef *)(ulong)(iVar1 - 1);
  switch(ctx_00) {
  case (runcxdef *)0x0:
    runpush(in_stack_ffffffffffffffd0,(dattyp)((ulong)lVar3 >> 0x20),(runsdef *)ctx_00);
    break;
  case (runcxdef *)0x1:
    runpushcstr(unaff_retaddr,in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                in_stack_ffffffffffffffec);
    break;
  case (runcxdef *)0x2:
    runpushcstr(unaff_retaddr,in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                in_stack_ffffffffffffffec);
    break;
  case (runcxdef *)0x3:
  case (runcxdef *)0x4:
  case (runcxdef *)0x5:
  case (runcxdef *)0x6:
  case (runcxdef *)0x7:
  case (runcxdef *)0x8:
  case (runcxdef *)0x9:
  case (runcxdef *)0xa:
  case (runcxdef *)0xb:
  case (runcxdef *)0xc:
  case (runcxdef *)0xd:
  case (runcxdef *)0xe:
  case (runcxdef *)0xf:
  case (runcxdef *)0x10:
  case (runcxdef *)0x11:
  case (runcxdef *)0x13:
  case (runcxdef *)0x14:
  case (runcxdef *)0x15:
  case (runcxdef *)0x16:
  case (runcxdef *)0x17:
  case (runcxdef *)0x18:
  case (runcxdef *)0x19:
  case (runcxdef *)0x1a:
  case (runcxdef *)0x1b:
  case (runcxdef *)0x1c:
  case (runcxdef *)0x1d:
  case (runcxdef *)0x1e:
  case (runcxdef *)0x21:
    iVar1 = os_get_sysinfo(iVar1,(void *)0x0,(long *)&stack0xffffffffffffffd0);
    if (iVar1 == 0) {
      runpnil(ctx_00);
    }
    else {
      runpnum(in_stack_ffffffffffffffd0,lVar3);
    }
    break;
  case (runcxdef *)0x12:
    tio_is_html_mode();
    runpush(in_stack_ffffffffffffffd0,(dattyp)((ulong)lVar3 >> 0x20),(runsdef *)ctx_00);
    break;
  case (runcxdef *)0x1f:
    iVar2 = os_get_sysinfo(4,(void *)0x0,(long *)&stack0xffffffffffffffd0);
    if ((iVar2 == 0) || (in_stack_ffffffffffffffd0 == (runcxdef *)0x0)) {
      runpnum(in_stack_ffffffffffffffd0,lVar3);
    }
    else {
      iVar1 = os_get_sysinfo(iVar1,(void *)0x0,(long *)&stack0xffffffffffffffd0);
      if (iVar1 == 0) {
        runpnum(in_stack_ffffffffffffffd0,lVar3);
      }
      else {
        runpnum(in_stack_ffffffffffffffd0,lVar3);
      }
    }
    break;
  case (runcxdef *)0x20:
    runpnum(in_stack_ffffffffffffffd0,lVar3);
    break;
  default:
    for (; 1 < in_ESI; in_ESI = in_ESI + -1) {
      *(long *)(*(long *)(in_RDI + 8) + 0x20) = *(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10;
    }
    runpnil(ctx_00);
  }
  return;
}

Assistant:

void bifsysinfo(bifcxdef *ctx, int argc)
{
    runsdef val;
    int id;
    long result;

    /* see what we have */
    switch(id = (int)runpopnum(ctx->bifcxrun))
    {
    case SYSINFO_SYSINFO:
        /* systemInfo call is supported in this version - return true */
        bifcntargs(ctx, 1, argc);
        val.runstyp = DAT_TRUE;
        runpush(ctx->bifcxrun, DAT_TRUE, &val);
        break;

    case SYSINFO_VERSION:
        /* get the run-time version string */
        bifcntargs(ctx, 1, argc);
        runpushcstr(ctx->bifcxrun, TADS_RUNTIME_VERSION,
                    strlen(TADS_RUNTIME_VERSION), 0);
        break;

    case SYSINFO_OS_NAME:
        /* get the operating system name */
        bifcntargs(ctx, 1, argc);
        runpushcstr(ctx->bifcxrun, OS_SYSTEM_NAME, strlen(OS_SYSTEM_NAME), 0);
        break;
        
    case SYSINFO_HTML:
    case SYSINFO_JPEG:
    case SYSINFO_PNG:
    case SYSINFO_WAV:
    case SYSINFO_MIDI:
    case SYSINFO_WAV_MIDI_OVL:
    case SYSINFO_WAV_OVL:
    case SYSINFO_PREF_IMAGES:
    case SYSINFO_PREF_SOUNDS:
    case SYSINFO_PREF_MUSIC:
    case SYSINFO_PREF_LINKS:
    case SYSINFO_MPEG:
    case SYSINFO_MPEG1:
    case SYSINFO_MPEG2:
    case SYSINFO_MPEG3:
    case SYSINFO_LINKS_HTTP:
    case SYSINFO_LINKS_FTP:
    case SYSINFO_LINKS_NEWS:
    case SYSINFO_LINKS_MAILTO:
    case SYSINFO_LINKS_TELNET:
    case SYSINFO_PNG_TRANS:
    case SYSINFO_PNG_ALPHA:
    case SYSINFO_OGG:
    case SYSINFO_MNG:
    case SYSINFO_MNG_TRANS:
    case SYSINFO_MNG_ALPHA:
    case SYSINFO_TEXT_HILITE:
    case SYSINFO_INTERP_CLASS:
        /* 
         *   these information types are all handled by the OS layer, and
         *   take no additional arguments 
         */
        bifcntargs(ctx, 1, argc);
        if (os_get_sysinfo(id, 0, &result))
        {
            /* we got a valid result - return it */
            runpnum(ctx->bifcxrun, result);
        }
        else
        {
            /* the code was unknown - return nil */
            runpnil(ctx->bifcxrun);
        }
        break;

    case SYSINFO_HTML_MODE:
        /* ask the output formatter for its current HTML setting */
        bifcntargs(ctx, 1, argc);
        val.runstyp = runclog(tio_is_html_mode());
        runpush(ctx->bifcxrun, val.runstyp, &val);
        break;

    case SYSINFO_TEXT_COLORS:
        /* 
         *   Text colors are only supported in full HTML interpreters.  If
         *   this is an HTML interpreter, ask the underlying OS layer about
         *   color support; otherwise, colors are not available, since we
         *   don't handle colors in our text-only HTML subset.
         *   
         *   Colors are NOT supported in the HTML mini-parser in text-only
         *   interpreters in TADS 2.  So, even if we're running in HTML
         *   mode, if this is a text-only interpreter, we can't display text
         *   colors.  
         */
        bifcntargs(ctx, 1, argc);
        if (os_get_sysinfo(SYSINFO_HTML, 0, &result) && result != 0)
        {
            /* 
             *   we're in HTML mode, so ask the underlying HTML OS
             *   implementation for its level of text color support 
             */
            if (os_get_sysinfo(id, 0, &result))
            {
                /* push the OS-level result */
                runpnum(ctx->bifcxrun, result);
            }
            else
            {
                /* the OS code doesn't recognize it; assume no support */
                runpnum(ctx->bifcxrun, SYSINFO_TXC_NONE);
            }
        }
        else
        {
            /* we're a text-only interpreter - no color support */
            runpnum(ctx->bifcxrun, SYSINFO_TXC_NONE);
        }
        break;

    case SYSINFO_BANNERS:
        /* TADS 2 does not offer banner support */
        bifcntargs(ctx, 1, argc);
        runpnum(ctx->bifcxrun, 0);
        break;
        
    default:
        /* 
         *   Other codes fail harmlessly with a nil return value.  Pop all
         *   remaining arguments and return nil. 
         */
        for ( ; argc > 1 ; --argc)
            rundisc(ctx->bifcxrun);
        runpnil(ctx->bifcxrun);
        break;
    }
}